

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Employee.cpp
# Opt level: O2

ostream * operator<<(ostream *o,Employee *e)

{
  ostream *poVar1;
  string *psVar2;
  Address *a;
  
  poVar1 = std::operator<<(o,"name-> ");
  psVar2 = Person::getName_abi_cxx11_(&e->super_Person);
  poVar1 = std::operator<<(poVar1,(string *)psVar2);
  poVar1 = std::operator<<(poVar1,", id-> ");
  psVar2 = Person::getId_abi_cxx11_(&e->super_Person);
  poVar1 = std::operator<<(poVar1,(string *)psVar2);
  poVar1 = std::operator<<(poVar1,", address-> ");
  a = Person::getAddress(&e->super_Person);
  poVar1 = operator<<(poVar1,a);
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"hour work= ");
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,e->hourWork);
  poVar1 = std::operator<<(poVar1,", salary per hour= ");
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,e->salaryPerHour);
  poVar1 = std::operator<<(poVar1,", work to do= ");
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,e->workToDo);
  poVar1 = std::operator<<(poVar1,", work done= ");
  std::ostream::operator<<((ostream *)poVar1,e->workDone);
  return o;
}

Assistant:

std::ostream &operator<<(ostream &o, const Employee &e) {

    o << "name-> " << e.getName() << ", id-> " << e.getId() << ", address-> " << e.getAddress() << endl
        << "hour work= " << e.getHourWork() << ", salary per hour= " << e.getSalaryPerHour() << ", work to do= " << e.getWorkToDo() << ", work done= " << e.getWorkDone();
    return o;
}